

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void demo_textprintf_right(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_2d8 [32];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char buf [512];
  
  ap[0].reg_save_area = local_2d8;
  if (in_AL != '\0') {
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x20;
  ap[0].fp_offset = 0x50;
  local_2b8 = in_R8;
  local_2b0 = in_R9;
  vsnprintf(buf,0x200,format,ap);
  demo_textprintf_ex(font,x,y,1,0x11185a,col.r,col.b,buf);
  return;
}

Assistant:

void demo_textprintf_right(const ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   demo_textprintf_ex(font, x, y, col, 1, "%s", buf);
}